

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

void __thiscall
QTextCursor::insertImage(QTextCursor *this,QTextImageFormat *format,Position alignment)

{
  QTextDocumentPrivate *pQVar1;
  uint o;
  int iVar2;
  QTextObject *this_00;
  QTextCursorPrivate *pQVar3;
  char *__filename;
  long in_FS_OFFSET;
  QStringView str;
  storage_type_conflict local_6a;
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).d.ptr;
  if (pQVar3 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      pQVar3 = (this->d).d.ptr;
    }
    if (pQVar3->priv != (QTextDocumentPrivate *)0x0) {
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrameFormat::QTextFrameFormat((QTextFrameFormat *)local_68);
      ::QVariant::QVariant((QVariant *)&local_58,alignment);
      QTextFormat::setProperty((QTextFormat *)local_68,0x800,(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      this_00 = QTextDocumentPrivate::createObject(pQVar3->priv,(QTextFormat *)local_68,-1);
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::QTextFormat((QTextFormat *)&local_58,(QTextFormat *)format);
      o = QTextObject::objectIndex(this_00);
      __filename = (char *)(ulong)o;
      QTextFormat::setObjectIndex((QTextFormat *)&local_58,o);
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      pQVar1 = pQVar3->priv;
      iVar2 = pQVar1->editBlock;
      pQVar1->editBlock = iVar2 + 1;
      if (iVar2 == 0) {
        pQVar1->revision = pQVar1->revision + 1;
      }
      if ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      QTextCursorPrivate::remove(pQVar3,__filename);
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      iVar2 = QTextFormatCollection::indexForFormat(&pQVar3->priv->formats,(QTextFormat *)&local_58)
      ;
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      pQVar1 = pQVar3->priv;
      if ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      local_6a = L'￼';
      str.m_data = &local_6a;
      str.m_size = 1;
      QTextDocumentPrivate::insert(pQVar1,pQVar3->position,str,iVar2);
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      QTextDocumentPrivate::endEditBlock(pQVar3->priv);
      QTextFormat::~QTextFormat((QTextFormat *)&local_58);
      QTextFormat::~QTextFormat((QTextFormat *)local_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertImage(const QTextImageFormat &format, QTextFrameFormat::Position alignment)
{
    if (!d || !d->priv)
        return;

    QTextFrameFormat ffmt;
    ffmt.setPosition(alignment);
    QTextObject *obj = d->priv->createObject(ffmt);

    QTextImageFormat fmt = format;
    fmt.setObjectIndex(obj->objectIndex());

    d->priv->beginEditBlock();
    d->remove();
    const int idx = d->priv->formatCollection()->indexForFormat(fmt);
    d->priv->insert(d->position, QChar(QChar::ObjectReplacementCharacter), idx);
    d->priv->endEditBlock();
}